

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

bool __thiscall Glucose::StringOption::parse(StringOption *this,char *str)

{
  bool bVar1;
  char *in_RSI;
  long in_RDI;
  char *span;
  char *local_20 [3];
  bool local_1;
  
  local_20[0] = in_RSI;
  bVar1 = match<char_const*>(local_20,"-");
  if (((bVar1) && (bVar1 = match<char_const*>(local_20,*(char **)(in_RDI + 8)), bVar1)) &&
     (bVar1 = match<char_const*>(local_20,"="), bVar1)) {
    *(char **)(in_RDI + 0x28) = local_20[0];
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

virtual bool parse(const char* str){
        const char* span = str; 

        if (!match(span, "-") || !match(span, name) || !match(span, "="))
            return false;

        value = span;
        return true;
    }